

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

_Bool array_container_add(array_container_t *arr,uint16_t value)

{
  int iVar1;
  uint16_t in_SI;
  array_container_t *in_RDI;
  int32_t in_stack_fffffffffffffff0;
  
  iVar1 = array_container_try_add(in_RDI,in_SI,in_stack_fffffffffffffff0);
  return iVar1 == 1;
}

Assistant:

static inline bool array_container_add(array_container_t *arr, uint16_t value) {
    return array_container_try_add(arr, value, INT32_MAX) == 1;
}